

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O1

void __thiscall
adios2::core::Operator::Operator
          (Operator *this,string *typeString,OperatorType typeEnum,string *category,
          Params *parameters)

{
  pointer pcVar1;
  
  this->_vptr_Operator = (_func_int **)&PTR__Operator_0087c5c8;
  (this->m_TypeString)._M_dataplus._M_p = (pointer)&(this->m_TypeString).field_2;
  pcVar1 = (typeString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_TypeString,pcVar1,pcVar1 + typeString->_M_string_length);
  this->m_TypeEnum = typeEnum;
  (this->m_Category)._M_dataplus._M_p = (pointer)&(this->m_Category).field_2;
  pcVar1 = (category->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_Category,pcVar1,pcVar1 + category->_M_string_length);
  helper::LowerCaseParams(&this->m_Parameters,parameters);
  (this->m_AccuracyRequested).error = 0.0;
  (this->m_AccuracyRequested).norm = 0.0;
  (this->m_AccuracyRequested).relative = false;
  (this->m_AccuracyProvided).error = 0.0;
  (this->m_AccuracyProvided).norm = 0.0;
  (this->m_AccuracyProvided).relative = false;
  return;
}

Assistant:

Operator::Operator(const std::string &typeString, const OperatorType typeEnum,
                   const std::string &category, const Params &parameters)
: m_TypeString(typeString), m_TypeEnum(typeEnum), m_Category(category),
  m_Parameters(helper::LowerCaseParams(parameters))
{
}